

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdsplitter.h
# Opt level: O1

void __thiscall mdsplit::mdsplitter::mdsplitter(mdsplitter *this)

{
  long lVar1;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined1 local_98 [32];
  _List local_78 [2];
  undefined8 local_68 [2];
  path local_58;
  
  std::filesystem::__cxx11::path::path<char[10],std::filesystem::__cxx11::path>
            (&this->input_,(char (*) [10])"README.md",auto_format);
  std::filesystem::current_path_abi_cxx11_();
  std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
            (&local_58,(char (*) [5])"docs",auto_format);
  std::filesystem::__cxx11::operator/(&this->output_dir_,(path *)local_98,&local_58);
  std::filesystem::__cxx11::path::~path(&local_58);
  std::filesystem::__cxx11::path::~path((path *)local_98);
  local_98._0_8_ = local_98 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"details","");
  _Var2._M_head_impl = (_Impl *)local_68;
  local_78[0]._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )_Var2._M_head_impl;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"summary","");
  __l._M_len = 2;
  __l._M_array = (iterator)local_98;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->clear_html_tags_,__l,(allocator_type *)&local_58);
  lVar1 = -0x40;
  do {
    if ((_Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         )_Var2._M_head_impl !=
        (_Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>)
        *(tuple<std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          *)&((tuple<std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
               *)(_Var2._M_head_impl + -0x10))->
             super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
       ) {
      operator_delete((void *)*(tuple<std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                *)&((tuple<std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                     *)(_Var2._M_head_impl + -0x10))->
                                   super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                      ,*(long *)_Var2._M_head_impl + 1);
    }
    _Var2._M_head_impl = _Var2._M_head_impl + -0x20;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0);
  (this->repository_)._M_dataplus._M_p = (pointer)&(this->repository_).field_2;
  (this->repository_)._M_string_length = 0;
  (this->repository_).field_2._M_local_buf[0] = '\0';
  this->max_split_level_ = 4;
  this->include_toc_ = true;
  this->jekyll_escape_ = true;
  this->indent_headers_ = true;
  this->add_front_matter_ = true;
  this->update_links_ = true;
  this->remove_autotoc_ = true;
  this->trace_ = true;
  this->erase_old_mdsplit_files_ = true;
  std::filesystem::__cxx11::path::path<char[9],std::filesystem::__cxx11::path>
            ((path *)local_98,(char (*) [9])"index.md",auto_format);
  std::filesystem::__cxx11::operator/
            (&this->current_output_file_,&this->output_dir_,(path *)local_98);
  std::filesystem::__cxx11::path::~path((path *)local_98);
  (this->sections_).super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sections_).super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sections_).super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

mdsplitter() = default;